

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.hpp
# Opt level: O0

void __thiscall
quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
::find_adjacent_facets
          (quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
           *this,facet *_facet,size_type f,size_type _skip)

{
  size_type sVar1;
  reference this_00;
  reference __p;
  size_t sVar2;
  reference pvVar3;
  reference prVar4;
  pair<std::__detail::_Node_iterator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_true,_false>,_bool>
  pVar5;
  ridge *ridge_;
  value_type local_70;
  _Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
  local_50;
  pair<std::__detail::_Node_iterator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_true,_false>,_bool>
  position;
  size_type v_1;
  size_type v;
  size_type ridge_hash_;
  size_type _skip_local;
  size_type f_local;
  facet *_facet_local;
  quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
  *this_local;
  
  v = 0;
  for (v_1 = 0; v_1 < this->dimension_; v_1 = v_1 + 1) {
    if (v_1 != _skip) {
      this_00 = std::
                vector<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                ::operator[](&_facet->vertices_,v_1);
      __p = std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>::
            operator*(this_00);
      sVar2 = std::hash<const_std::forward_list<double,_std::allocator<double>_>_*>::operator()
                        ((hash<const_std::forward_list<double,_std::allocator<double>_>_*> *)
                         &this->field_0x1a8,__p);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->vertices_hashes_,v_1);
      *pvVar3 = sVar2;
      v = sVar2 ^ v;
    }
  }
  position.second = false;
  position._9_7_ = 0;
  for (; (ulong)position._8_8_ < this->dimension_; position._8_8_ = position._8_8_ + 1) {
    if (position._8_8_ != _skip) {
      local_70.v = position._8_8_;
      local_70.facet_ = _facet;
      local_70.f = f;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->vertices_hashes_,position._8_8_);
      local_70.hash_ = v ^ *pvVar3;
      pVar5 = std::
              unordered_set<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge_hash,_std::equal_to<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>_>
              ::insert(&this->unique_ridges_,&local_70);
      local_50._M_cur =
           (__node_type *)
           pVar5.first.
           super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
           ._M_cur;
      position.first.
      super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
      ._M_cur._0_1_ = pVar5.second;
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        prVar4 = std::__detail::
                 _Node_iterator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_true,_false>
                 ::operator*((_Node_iterator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_true,_false>
                              *)&local_50);
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&prVar4->facet_->neighbours_,prVar4->v);
        *pvVar3 = f;
        sVar1 = prVar4->f;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&_facet->neighbours_,position._8_8_);
        *pvVar3 = sVar1;
        std::
        unordered_set<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge_hash,_std::equal_to<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>_>
        ::erase(&this->unique_ridges_,(iterator)local_50._M_cur);
      }
    }
  }
  return;
}

Assistant:

void
    find_adjacent_facets(facet & _facet,
                         size_type const f,
                         size_type const _skip)
    {
        size_type ridge_hash_ = 0;
        for (size_type v = 0; v < dimension_; ++v) {
            if (v != _skip) {
                ridge_hash_ ^= (vertices_hashes_[v] = point_hash_(std::addressof(*_facet.vertices_[v])));
            }
        }
        for (size_type v = 0; v < dimension_; ++v) {
            if (v != _skip) { // neighbouring facet against apex (_skip-indexed) is known atm
                auto const position = unique_ridges_.insert({_facet, f, v, (ridge_hash_ ^ vertices_hashes_[v])});
                if (!position.second) {
                    ridge const & ridge_ = *position.first;
                    ridge_.facet_.neighbours_[ridge_.v] = f;
                    _facet.neighbours_[v] = ridge_.f;
                    unique_ridges_.erase(position.first);
                }
            }
        }
    }